

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitStringEncode
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,StringEncode *curr)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  Literal *pLVar5;
  Literal *this_00;
  uint uVar6;
  anon_union_16_6_1532cd5a_for_Literal_0 local_150;
  undefined8 local_140;
  undefined1 local_138 [8];
  Flow str;
  Flow array;
  Flow start;
  long local_58;
  shared_ptr<wasm::GCData> arrayData;
  shared_ptr<wasm::GCData> strData;
  
  pcVar2 = _extendLowUToI32x4;
  sVar1 = NONCONSTANT_FLOW;
  if (*(int *)(curr + 0x10) != 1) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
    return __return_storage_ptr__;
  }
  visit((Flow *)local_138,this,*(Expression **)(curr + 0x18));
  if (str.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&str.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x20));
    if (array.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&array.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x28));
      if (start.breakTo.super_IString.str._M_len == 0) {
        if ((((long)((long)str.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start -
                    str.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
             ) * -0x5555555555555555 + (long)local_138 != 1) ||
           (wasm::Literal::getGCData(),
           str.breakTo.super_IString.str._M_str +
           ((long)((long)array.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start -
                  array.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
           ) * -0x5555555555555555 != (char *)0x1)) {
LAB_001400b0:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x52,"const Literal &wasm::Flow::getSingleValue()");
        }
        wasm::Literal::getGCData();
        if ((arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (local_58 == 0)) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        if (array.breakTo.super_IString.str._M_str +
            ((long)((long)start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != (char *)0x1) goto LAB_001400b0;
        start.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
        uVar4 = ((long)arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                 *(long *)&arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[2]._M_use_count >> 3) * -0x5555555555555555 +
                *(long *)&(arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count;
        if ((CARRY8(uVar4,(ulong)start.breakTo.super_IString.str._M_str)) ||
           ((char *)((*(long *)(local_58 + 0x30) - *(long *)(local_58 + 0x28) >> 3) *
                     -0x5555555555555555 + *(long *)(local_58 + 8)) <
            start.breakTo.super_IString.str._M_str + uVar4)) {
          (*this->_vptr_ExpressionRunner[2])(this,"oob");
        }
        lVar3 = *(long *)&arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._M_use_count;
        if (((long)arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[3]._vptr__Sp_counted_base - lVar3 >> 3) * -0x5555555555555555 +
            *(long *)&(arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count != 0) {
          uVar6 = 1;
          uVar4 = 0;
          do {
            pLVar5 = (Literal *)(lVar3 + -0x18 + uVar4 * 0x18);
            if (uVar6 == 1) {
              pLVar5 = (Literal *)
                       (arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 1);
            }
            this_00 = (Literal *)
                      (*(long *)(local_58 + 0x28) + -0x18 +
                      (long)(start.breakTo.super_IString.str._M_str + uVar4) * 0x18);
            if (start.breakTo.super_IString.str._M_str + uVar4 == (char *)0x0) {
              this_00 = (Literal *)(local_58 + 0x10);
            }
            wasm::Literal::operator=(this_00,pLVar5);
            uVar4 = (ulong)uVar6;
            lVar3 = *(long *)&arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi[2]._M_use_count;
            uVar6 = uVar6 + 1;
          } while (uVar4 < (ulong)(((long)arrayData.
                                          super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi[3]._vptr__Sp_counted_base - lVar3 >> 3)
                                   * -0x5555555555555555 +
                                  *(long *)&(arrayData.
                                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_M_use_count));
        }
        local_150.i32 =
             (int)((ulong)((long)arrayData.
                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                          *(long *)&arrayData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi[2]._M_use_count) >> 3) * -0x55555555 +
             (arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count;
        local_140 = 2;
        Flow::Flow(__return_storage_ptr__,(Literal *)&local_150.func);
        wasm::Literal::~Literal((Literal *)&local_150.func);
        if (arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)array.breakTo.super_IString.str._M_str;
        wasm::Literal::Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&start);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)start.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      wasm::Literal::~Literal((Literal *)&start);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)str.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&array);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)array.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           array.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           array.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      array.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      array.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      array.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)array.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)array.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &array.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&array);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_138;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&str);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)str.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         str.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         str.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    str.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    str.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    str.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)str.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)str.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &str.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEncode(StringEncode* curr) {
    // For now we only support JS-style strings into arrays.
    if (curr->op != StringEncodeWTF16Array) {
      return Flow(NONCONSTANT_FLOW);
    }

    Flow str = visit(curr->str);
    if (str.breaking()) {
      return str;
    }
    Flow array = visit(curr->array);
    if (array.breaking()) {
      return array;
    }
    Flow start = visit(curr->start);
    if (start.breaking()) {
      return start;
    }

    auto strData = str.getSingleValue().getGCData();
    auto arrayData = array.getSingleValue().getGCData();
    if (!strData || !arrayData) {
      trap("null ref");
    }
    auto startVal = start.getSingleValue().getUnsigned();
    auto& strValues = strData->values;
    auto& arrayValues = arrayData->values;
    size_t end;
    if (std::ckd_add<size_t>(&end, startVal, strValues.size()) ||
        end > arrayValues.size()) {
      trap("oob");
    }

    for (Index i = 0; i < strValues.size(); i++) {
      arrayValues[startVal + i] = strValues[i];
    }

    return Literal(int32_t(strData->values.size()));
  }